

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall Jupiter::File::addData(File *this,string_view data)

{
  bool bVar1;
  reference __args;
  basic_string_view<char,_std::char_traits<char>_> *line;
  iterator __end1;
  iterator __begin1;
  container_type *__range1;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined1 local_40 [8];
  container_type lines;
  File *this_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  this_local = (File *)data._M_len;
  lines.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  local_50 = sv("\r\n",2);
  jessilib::
  word_split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ((container_type *)local_40,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_50);
  bVar1 = std::
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::empty((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_40);
  if (bVar1) {
    data_local._M_str._7_1_ = 0;
  }
  else {
    __end1 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_40);
    line = (basic_string_view<char,_std::char_traits<char>_> *)
           std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_40);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        (&__end1,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  *)&line);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __args = __gnu_cxx::
               __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator*(&__end1);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->m_data->lines,__args);
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&__end1);
    }
    data_local._M_str._7_1_ = 1;
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_40);
  return (bool)(data_local._M_str._7_1_ & 1);
}

Assistant:

bool Jupiter::File::addData(std::string_view data) {
	auto lines = jessilib::word_split_view(data, "\r\n"sv);
	if (lines.empty()) {
		return false;
	}

	for (const auto& line : lines) {
		m_data->lines.emplace_back(line);
	}
	return true;
}